

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O0

void __thiscall
duckdb::StandardWriterPageState<duckdb::float_na_equal,_float,_duckdb::FloatingPointOperator>::
StandardWriterPageState
          (StandardWriterPageState<duckdb::float_na_equal,_float,_duckdb::FloatingPointOperator>
           *this,idx_t total_value_count,idx_t total_string_size,type encoding_p,
          PrimitiveDictionary<duckdb::float_na_equal,_float,_duckdb::FloatingPointOperator>
          *dictionary_p)

{
  byte bVar1;
  idx_t val;
  undefined4 in_ECX;
  idx_t in_RSI;
  DlbaEncoder *in_RDI;
  int64_t in_R8;
  idx_t in_stack_ffffffffffffffa8;
  idx_t in_stack_ffffffffffffffb0;
  
  ColumnWriterPageState::ColumnWriterPageState((ColumnWriterPageState *)in_RDI);
  (in_RDI->dbp_encoder).total_value_count = (idx_t)&PTR__StandardWriterPageState_00bfd328;
  *(undefined4 *)&(in_RDI->dbp_encoder).count = in_ECX;
  *(undefined1 *)((long)&(in_RDI->dbp_encoder).count + 4) = 0;
  DbpEncoder::DbpEncoder((DbpEncoder *)&(in_RDI->dbp_encoder).previous_value,in_RSI);
  in_RDI->field_0x4840 = 0;
  DlbaEncoder::DlbaEncoder(in_RDI,(idx_t)&in_RDI->field_0x4848,in_stack_ffffffffffffffb0);
  in_RDI[1].field_0x4848 = 0;
  BssEncoder::BssEncoder((BssEncoder *)&in_RDI[1].stream,in_stack_ffffffffffffffa8,0x5faa39);
  in_RDI[2].dbp_encoder.data[1] = in_R8;
  *(undefined1 *)(in_RDI[2].dbp_encoder.data + 2) = 0;
  val = PrimitiveDictionary<duckdb::float_na_equal,_float,_duckdb::FloatingPointOperator>::GetSize
                  ((PrimitiveDictionary<duckdb::float_na_equal,_float,_duckdb::FloatingPointOperator>
                    *)in_RDI[2].dbp_encoder.data[1]);
  bVar1 = RleBpDecoder::ComputeBitWidth(val);
  *(uint *)((long)in_RDI[2].dbp_encoder.data + 0x14) = (uint)bVar1;
  RleBpEncoder::RleBpEncoder
            ((RleBpEncoder *)(in_RDI[2].dbp_encoder.data + 3),
             *(uint32_t *)((long)in_RDI[2].dbp_encoder.data + 0x14));
  return;
}

Assistant:

explicit StandardWriterPageState(const idx_t total_value_count, const idx_t total_string_size,
	                                 duckdb_parquet::Encoding::type encoding_p,
	                                 const PrimitiveDictionary<SRC, TGT, OP> &dictionary_p)
	    : encoding(encoding_p), dbp_initialized(false), dbp_encoder(total_value_count), dlba_initialized(false),
	      dlba_encoder(total_value_count, total_string_size), bss_initialized(false),
	      bss_encoder(total_value_count, sizeof(TGT)), dictionary(dictionary_p), dict_written_value(false),
	      dict_bit_width(RleBpDecoder::ComputeBitWidth(dictionary.GetSize())), dict_encoder(dict_bit_width) {
	}